

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeysetTest.h
# Opt level: O1

void Prn_gen<Blob<160>>(int nbRn,pfHash hash,vector<Blob<160>,_std::allocator<Blob<160>_>_> *hashes)

{
  Blob<160> h;
  undefined1 local_68 [16];
  uint8_t local_58 [16];
  undefined1 local_48 [16];
  uint8_t local_38 [16];
  
  printf("Generating %i random numbers : \n",(ulong)(uint)nbRn);
  local_68 = ZEXT816(0) << 0x40;
  local_38[0] = '\0';
  local_38[1] = '\0';
  local_38[2] = '\0';
  local_38[3] = '\0';
  if (0 < nbRn) {
    local_48 = local_68;
    do {
      local_58[0] = '\0';
      local_58[1] = '\0';
      local_58[2] = '\0';
      local_58[3] = '\0';
      (*hash)(local_48,0x14,0,local_68);
      std::vector<Blob<160>,_std::allocator<Blob<160>_>_>::push_back(hashes,(value_type *)local_68);
      local_38[0] = local_58[0];
      local_38[1] = local_58[1];
      local_38[2] = local_58[2];
      local_38[3] = local_58[3];
      local_48 = local_68;
      local_68 = ZEXT816(0) << 0x20;
      nbRn = nbRn + -1;
    } while (nbRn != 0);
  }
  return;
}

Assistant:

void Prn_gen (int nbRn, pfHash hash, std::vector<hashtype> & hashes )
{
  assert(nbRn < 0);

  printf("Generating %i random numbers : \n", nbRn);

  hashtype hcopy;
  memset(&hcopy, 0, sizeof(hcopy));

  // a generated random number becomes the input for the next one
  for (int i=0; i< nbRn; i++) {
      hashtype h;
      hash(&hcopy, sizeof(hcopy), 0, &h);
      hashes.push_back(h);
      memcpy(&hcopy, &h, sizeof(h));
  }
}